

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnWriter::Prepare
          (StructColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  pointer pCVar1;
  reference this_02;
  type pCVar2;
  reference this_03;
  type pVVar3;
  idx_t child_idx;
  ulong uVar4;
  reference rVar5;
  
  FlatVector::VerifyFlatVector(vector);
  if (parent != (ColumnWriterState *)0x0) {
    while (uVar4 = (ulong)(state_p->is_empty).super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)(state_p->is_empty).super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)(state_p->is_empty).super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p) * 8,
          uVar4 < (ulong)(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_p -
                  (long)(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_start.super__Bit_iterator_base._M_p) * 8) {
      rVar5 = vector<bool,_true>::get<true>(&parent->is_empty,uVar4);
      ::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&state_p->is_empty,
                 (*rVar5._M_p & rVar5._M_mask) != 0);
    }
  }
  ColumnWriter::HandleRepeatLevels
            (&this->super_ColumnWriter,state_p,parent,count,
             ((this->super_ColumnWriter).column_schema)->max_repeat);
  ColumnWriter::HandleDefineLevels
            (&this->super_ColumnWriter,state_p,parent,&vector->validity,count,0xffff,
             (short)(int)((this->super_ColumnWriter).column_schema)->max_define - 1);
  this_00 = StructVector::GetEntries(vector);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->child_writers).
                            super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->child_writers).
                            super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
              ::get<true>(&this->child_writers,uVar4);
    pCVar1 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
             operator->(this_01);
    this_02 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                           *)&state_p[1].definition_levels.
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish,uVar4);
    pCVar2 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             ::operator*(this_02);
    this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_00,uVar4);
    pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_03);
    (*pCVar1->_vptr_ColumnWriter[6])(pCVar1,pCVar2,state_p,pVVar3,count);
  }
  return;
}

Assistant:

void StructColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<StructColumnWriterState>();

	auto &validity = FlatVector::Validity(vector);
	if (parent) {
		// propagate empty entries from the parent
		while (state.is_empty.size() < parent->is_empty.size()) {
			state.is_empty.push_back(parent->is_empty[state.is_empty.size()]);
		}
	}
	HandleRepeatLevels(state_p, parent, count, MaxRepeat());
	HandleDefineLevels(state_p, parent, validity, count, PARQUET_DEFINE_VALID, MaxDefine() - 1);
	auto &child_vectors = StructVector::GetEntries(vector);
	for (idx_t child_idx = 0; child_idx < child_writers.size(); child_idx++) {
		child_writers[child_idx]->Prepare(*state.child_states[child_idx], &state_p, *child_vectors[child_idx], count);
	}
}